

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O3

void __thiscall
ListNodes<std::shared_ptr<Itemset>_>::~ListNodes(ListNodes<std::shared_ptr<Itemset>_> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  p_Var1 = (this->theNext).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->theNext).
  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    p_Var1 = (this->theItem).super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
  }
  p_Var1 = (this->theNext).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

ListNodes<T>::~ListNodes() {
    theNext = nullptr;
    theItem = nullptr;
}